

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void __thiscall embree::Texture::Texture(Texture *this,Ref<embree::Image> *img,string *fileName)

{
  uint uVar1;
  pointer pcVar2;
  uchar *dest;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  this->width = (uint)img->ptr->width;
  this->height = (uint)img->ptr->height;
  this->format = RGBA8;
  this->bytesPerTexel = 4;
  this->width_mask = 0;
  this->height_mask = 0;
  this->data = (void *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  pcVar2 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fileName,pcVar2,pcVar2 + fileName->_M_string_length);
  uVar1 = this->width;
  uVar3 = uVar1;
  do {
    uVar5 = uVar3;
    if (uVar5 < 2) break;
    uVar3 = uVar5 >> 1;
  } while ((uVar5 & 1) == 0);
  uVar3 = 0;
  if (uVar5 == 1) {
    uVar3 = uVar1 - 1;
  }
  this->width_mask = uVar3;
  uVar3 = this->height;
  uVar5 = uVar3;
  do {
    uVar4 = uVar5;
    if (uVar4 < 2) break;
    uVar5 = uVar4 >> 1;
  } while ((uVar4 & 1) == 0);
  uVar5 = 0;
  if (uVar4 == 1) {
    uVar5 = uVar3 - 1;
  }
  this->height_mask = uVar5;
  dest = (uchar *)alignedUSMMalloc((ulong)(uVar1 * uVar3 * 4),0x10,DEVICE_READ_ONLY);
  this->data = dest;
  Image::convertToRGBA8(img->ptr,dest);
  return;
}

Assistant:

Texture::Texture(Ref<Image> img, const std::string fileName)
    : width(unsigned(img->width)), height(unsigned(img->height)), format(RGBA8), bytesPerTexel(4), width_mask(0), height_mask(0), data(nullptr), fileName(fileName)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(4*width*height,16);
    img->convertToRGBA8((unsigned char*)data);
  }